

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rigid-body-kinematics.hxx
# Opt level: O2

Matrix4 * stateObservation::kine::vector6ToHomogeneousMatrix
                    (Matrix4 *__return_storage_ptr__,Vector6 *v)

{
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_120 [24];
  Matrix3 local_108;
  Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> local_c0;
  AngleAxis local_88;
  Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> local_68;
  
  Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::Identity();
  Eigen::PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,4,4,0,4,4>>>
            ((PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>> *)__return_storage_ptr__,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
              *)&local_108);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::tail<int>
            ((Type *)&local_c0,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)v,3);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>const,_1,1,false>>
            (local_120,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
             &local_c0);
  rotationVectorToAngleAxis(&local_88,(Vector3 *)local_120);
  Eigen::AngleAxis<double>::toRotationMatrix(&local_108,&local_88);
  Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>::Block
            (&local_68,__return_storage_ptr__,0,0,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Matrix<double,3,3,0,3,3>>
            (&local_68,&local_108);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::head<int>
            ((Type *)&local_108,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)v,3);
  Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>::Block
            (&local_c0,__return_storage_ptr__,0,3,3,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>const,_1,1,false>>
            (&local_c0,(Block<const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&local_108
            );
  return __return_storage_ptr__;
}

Assistant:

inline Matrix4 vector6ToHomogeneousMatrix(const Vector6 & v)
{
  Matrix4 M(Matrix4::Identity());
  M.block(0, 0, 3, 3) = rotationVectorToAngleAxis(Vector3(v.tail(3))).toRotationMatrix();
  M.block(0, 3, 3, 1) = v.head(3);
  return M;
}